

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

Slot * __thiscall Model<Slot>::save(Model<Slot> *this)

{
  Slot *pSVar1;
  pair<int,_Slot> pStack_988;
  
  pSVar1 = (Slot *)__dynamic_cast(this,&typeinfo,&Slot::typeinfo,0);
  if (pSVar1 != (Slot *)0x0) {
    std::pair<int,_Slot>::pair<int_&,_Slot_&,_true>(&pStack_988,&this->id,pSVar1);
    std::
    _Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
    ::_M_emplace_unique<std::pair<int,Slot>>
              ((_Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
                *)&objectList,&pStack_988);
    pSVar1 = (Slot *)__dynamic_cast(this,&typeinfo,&Slot::typeinfo,0);
    if (pSVar1 != (Slot *)0x0) {
      return pSVar1;
    }
  }
  __cxa_bad_cast();
}

Assistant:

T &Model<T>::save() {
    Model<T>::objectList.insert(pair<int, T>(this->id, dynamic_cast<T &> (*this)));
    return dynamic_cast<T &> (*this);
}